

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# substitute.cc
# Opt level: O2

void __thiscall absl::lts_20250127::substitute_internal::Arg::Arg(Arg *this,Hex hex)

{
  Arg *pAVar1;
  bool bVar2;
  char __tmp;
  long lVar3;
  size_t __n;
  ulong uVar4;
  Arg *__s;
  Arg *pAVar5;
  
  pAVar1 = this + 1;
  lVar3 = 0;
  uVar4 = hex.value;
  pAVar5 = pAVar1;
  do {
    pAVar5[-1].scratch_[0x1f] = "0123456789abcdef"[(uint)uVar4 & 0xf];
    pAVar5 = (Arg *)(pAVar5[-1].scratch_ + 0x1f);
    lVar3 = lVar3 + 1;
    bVar2 = 0xf < uVar4;
    uVar4 = uVar4 >> 4;
  } while (bVar2);
  uVar4 = (ulong)hex.width;
  __n = uVar4 - lVar3;
  if (__n == 0 || (long)uVar4 < lVar3) {
    __s = (Arg *)((long)pAVar1 - lVar3);
  }
  else {
    __s = (Arg *)((long)pAVar1 - uVar4);
    pAVar5 = __s;
    if (0 < (long)__n) {
      memset(__s,hex._9_4_ & 0xff,__n);
    }
  }
  (this->piece_)._M_len = (long)pAVar1 - (long)__s;
  (this->piece_)._M_str = (char *)pAVar5;
  return;
}

Assistant:

Arg::Arg(Hex hex) {
  char* const end = &scratch_[numbers_internal::kFastToBufferSize];
  char* writer = end;
  uint64_t value = hex.value;
  do {
    *--writer = absl::numbers_internal::kHexChar[value & 0xF];
    value >>= 4;
  } while (value != 0);

  char* beg;
  if (end - writer < hex.width) {
    beg = end - hex.width;
    std::fill_n(beg, writer - beg, hex.fill);
  } else {
    beg = writer;
  }

  piece_ = absl::string_view(beg, static_cast<size_t>(end - beg));
}